

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_astar.hpp
# Opt level: O0

void __thiscall compress::CompressAstar<Tiles>::CompressAstar(CompressAstar<Tiles> *this,Tiles *d)

{
  Tiles *in_RSI;
  SearchAlg<Tiles> *in_RDI;
  size_t in_stack_00000130;
  bool in_stack_0000013d;
  bool in_stack_0000013e;
  bool in_stack_0000013f;
  CompressClosedList<Node<Tiles>_> *in_stack_00000140;
  
  SearchAlg<Tiles>::SearchAlg(in_RDI,in_RSI);
  in_RDI->_vptr_SearchAlg = (_func_int **)&PTR_search_0014a920;
  compunits::operator____MiB((unsigned_long_long)(in_RDI + 1));
  CompressClosedList<Node<Tiles>_>::CompressClosedList
            (in_stack_00000140,in_stack_0000013f,in_stack_0000013e,in_stack_0000013d,
             in_stack_00000130);
  CompressOpenList<Node<Tiles>_>::CompressOpenList((CompressOpenList<Node<Tiles>_> *)0x10737b);
  std::vector<Tiles::State,_std::allocator<Tiles::State>_>::vector
            ((vector<Tiles::State,_std::allocator<Tiles::State>_> *)0x10738e);
  return;
}

Assistant:

CompressAstar(D &d) : SearchAlg<D>(d),
            closed(true, true, true, 950_MiB), // TODO: move to user option
            open() { }